

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O0

char * flatcc_json_parser_string_escape(flatcc_json_parser_t *ctx,char *buf,char *end,char *code)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  uint local_3c;
  uint local_38;
  uint32_t u2;
  uint32_t u;
  char v;
  char c;
  char *code_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  _u = code;
  code_local = end;
  end_local = buf;
  buf_local = (char *)ctx;
  if (((long)end - (long)buf < 2) || (*buf != '\\')) {
    *code = '\0';
    ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,buf,end,0x12);
  }
  else {
    switch(buf[1]) {
    case '\"':
      *code = '\x01';
      code[1] = '\"';
      ctx_local = (flatcc_json_parser_t *)(buf + 2);
      break;
    default:
      *code = '\0';
      ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,buf,end,0x12);
      break;
    case '/':
      *code = '\x01';
      code[1] = '/';
      ctx_local = (flatcc_json_parser_t *)(buf + 2);
      break;
    case '\\':
      *code = '\x01';
      code[1] = '\\';
      ctx_local = (flatcc_json_parser_t *)(buf + 2);
      break;
    case 'b':
      *code = '\x01';
      code[1] = '\b';
      ctx_local = (flatcc_json_parser_t *)(buf + 2);
      break;
    case 'f':
      *code = '\x01';
      code[1] = '\f';
      ctx_local = (flatcc_json_parser_t *)(buf + 2);
      break;
    case 'n':
      *code = '\x01';
      code[1] = '\n';
      ctx_local = (flatcc_json_parser_t *)(buf + 2);
      break;
    case 'r':
      *code = '\x01';
      code[1] = '\r';
      ctx_local = (flatcc_json_parser_t *)(buf + 2);
      break;
    case 't':
      *code = '\x01';
      code[1] = '\t';
      ctx_local = (flatcc_json_parser_t *)(buf + 2);
      break;
    case 'u':
      if ((long)end - (long)buf < 6) {
        *code = '\0';
        ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,buf,end,0x12);
      }
      else {
        iVar2 = decode_hex4(buf + 2,&local_38);
        if (iVar2 == 0) {
          if (((((local_38 < 0xd800) || (0xdbff < local_38)) ||
               ((long)code_local - (long)end_local < 0xc)) ||
              ((end_local[6] != '\\' || (end_local[7] != 'u')))) ||
             ((iVar2 = decode_hex4(end_local + 8,&local_3c), iVar2 != 0 ||
              ((local_3c < 0xdc00 || (0xdfff < local_3c)))))) {
            decode_unicode_char(local_38,_u);
            ctx_local = (flatcc_json_parser_t *)(end_local + 6);
          }
          else {
            iVar2 = decode_utf16_surrogate_pair(local_38,local_3c,_u);
            if (iVar2 == 0) {
              ctx_local = (flatcc_json_parser_t *)(end_local + 0xc);
            }
            else {
              *_u = '\0';
              ctx_local = (flatcc_json_parser_t *)
                          flatcc_json_parser_set_error
                                    ((flatcc_json_parser_t *)buf_local,end_local,code_local,0x12);
            }
          }
        }
        else {
          *_u = '\0';
          ctx_local = (flatcc_json_parser_t *)
                      flatcc_json_parser_set_error
                                ((flatcc_json_parser_t *)buf_local,end_local,code_local,0x12);
        }
      }
      break;
    case 'x':
      u2._2_1_ = 0;
      *code = '\x01';
      if ((long)end - (long)buf < 4) {
        *code = '\0';
        ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,buf,end,0x12);
      }
      else {
        bVar1 = buf[2];
        if (((char)bVar1 < '0') || ('9' < (char)bVar1)) {
          u2._3_1_ = bVar1 | 0x20;
          if (((char)u2._3_1_ < 'a') || ('f' < (char)u2._3_1_)) {
            *code = '\0';
            pcVar3 = flatcc_json_parser_set_error(ctx,buf,end,0x12);
            return pcVar3;
          }
          bVar1 = u2._3_1_ + 0xa9;
        }
        u2._2_1_ = bVar1 * '\x10';
        bVar1 = buf[3];
        if (((char)bVar1 < '0') || ('9' < (char)bVar1)) {
          u2._3_1_ = bVar1 | 0x20;
          if (((char)u2._3_1_ < 'a') || ('f' < (char)u2._3_1_)) {
            *code = '\0';
            pcVar3 = flatcc_json_parser_set_error(ctx,buf,end,0x12);
            return pcVar3;
          }
          bVar1 = u2._3_1_ + 0xa9;
        }
        else {
          bVar1 = bVar1 - 0x30;
        }
        u2._2_1_ = u2._2_1_ | bVar1;
        code[1] = u2._2_1_;
        ctx_local = (flatcc_json_parser_t *)(buf + 4);
      }
    }
  }
  return (char *)ctx_local;
}

Assistant:

const char *flatcc_json_parser_string_escape(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_json_parser_escape_buffer_t code)
{
    char c, v;
    uint32_t u, u2;

    if (end - buf < 2 || buf[0] != '\\') {
        code[0] = 0;
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
    }
    switch (buf[1]) {
    case 'x':
        v = 0;
        code[0] = 1;
        if (end - buf < 4) {
            code[0] = 0;
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
        }
        c = buf[2];
        if (c >= '0' && c <= '9') {
            v |= (c - '0') << 4;
        } else {
            /* Lower case. */
            c |= 0x20;
            if (c >= 'a' && c <= 'f') {
                v |= (c - 'a' + 10) << 4;
            } else {
                code[0] = 0;
                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
            }
        }
        c = buf[3];
        if (c >= '0' && c <= '9') {
            v |= c - '0';
        } else {
            /* Lower case. */
            c |= 0x20;
            if (c >= 'a' && c <= 'f') {
                v |= c - 'a' + 10;
            } else {
                code[0] = 0;
                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
            }
        }
        code[1] = v;
        return buf + 4;
    case 'u':
        if (end - buf < 6) {
            code[0] = 0;
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
        }
        if (decode_hex4(buf + 2, &u)) {
            code[0] = 0;
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
        };
        /* If a high UTF-16 surrogate half pair was detected */
        if (u >= 0xd800 && u <= 0xdbff &&
                /* and there is space for a matching low half pair */
                end - buf >= 12 &&
                /* and there is a second escape following immediately */
                buf[6] == '\\' && buf[7] == 'u' &&
                /* and it is valid hex */
                decode_hex4(buf + 8, &u2) == 0 &&
                /* and it is a low UTF-16 surrogate pair */
                u2 >= 0xdc00 && u2 <= 0xdfff) {
            /* then decode the pair into a single 4 byte utf-8 sequence. */
            if (decode_utf16_surrogate_pair(u, u2, code)) {
                code[0] = 0;
                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
            }
            return buf + 12;
            /*
             *  Otherwise decode unmatched surrogate pairs as is any
             *  other UTF-8. Some systems might depend on these surviving.
             *  Leave ignored errors for the next parse step.
             */
        }
        decode_unicode_char(u, code);
        return buf + 6;
    case 't':
        code[0] = 1;
        code[1] = '\t';
        return buf + 2;
    case 'n':
        code[0] = 1;
        code[1] = '\n';
        return buf + 2;
    case 'r':
        code[0] = 1;
        code[1] = '\r';
        return buf + 2;
    case 'b':
        code[0] = 1;
        code[1] = '\b';
        return buf + 2;
    case 'f':
        code[0] = 1;
        code[1] = '\f';
        return buf + 2;
    case '\"':
        code[0] = 1;
        code[1] = '\"';
        return buf + 2;
    case '\\':
        code[0] = 1;
        code[1] = '\\';
        return buf + 2;
    case '/':
        code[0] = 1;
        code[1] = '/';
        return buf + 2;
    default:
        code[0] = 0;
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
    }
}